

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# segment_o1.cc
# Opt level: O0

unique_ptr<lf::geometry::Geometry,_std::default_delete<lf::geometry::Geometry>_> __thiscall
lf::geometry::SegmentO1::SubGeometry(SegmentO1 *this,dim_t codim,dim_t i)

{
  runtime_error *this_00;
  uint in_ECX;
  undefined4 in_register_00000034;
  string local_750;
  allocator<char> local_729;
  string local_728;
  allocator<char> local_701;
  string local_700;
  stringstream local_6e0 [8];
  stringstream ss_2;
  ostream local_6d0 [376];
  ConstColXpr local_558;
  undefined1 local_520 [16];
  string local_510;
  allocator<char> local_4e9;
  string local_4e8;
  allocator<char> local_4c1;
  string local_4c0;
  string local_4a0;
  allocator<char> local_479;
  string local_478;
  allocator<char> local_451;
  string local_450;
  stringstream local_430 [8];
  stringstream ss_1;
  ostream local_420 [376];
  undefined1 local_2a8 [16];
  string local_298;
  allocator<char> local_271;
  string local_270;
  allocator<char> local_249;
  string local_248;
  string local_228;
  allocator<char> local_201;
  string local_200;
  allocator<char> local_1d9;
  string local_1d8;
  stringstream local_1a8 [8];
  stringstream ss;
  ostream local_198 [380];
  dim_t local_1c;
  dim_t i_local;
  dim_t codim_local;
  SegmentO1 *this_local;
  
  _i_local = CONCAT44(in_register_00000034,codim);
  local_1c = i;
  this_local = this;
  if (i == 0) {
    if (in_ECX != 0) {
      std::__cxx11::stringstream::stringstream(local_1a8);
      std::operator<<(local_198,"i is out of bounds.");
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_1d8,"i == 0",&local_1d9);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_200,
                 "/workspace/llm4binary/github/license_c_cmakelists/craffael[P]lehrfempp/lib/lf/geometry/segment_o1.cc"
                 ,&local_201);
      std::__cxx11::stringstream::str();
      lf::base::AssertionFailed(&local_1d8,&local_200,0x23,&local_228);
      std::__cxx11::string::~string((string *)&local_228);
      std::__cxx11::string::~string((string *)&local_200);
      std::allocator<char>::~allocator(&local_201);
      std::__cxx11::string::~string((string *)&local_1d8);
      std::allocator<char>::~allocator(&local_1d9);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_248,"false",&local_249);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_270,
                 "/workspace/llm4binary/github/license_c_cmakelists/craffael[P]lehrfempp/lib/lf/geometry/segment_o1.cc"
                 ,&local_271);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_298,"",(allocator<char> *)(local_2a8 + 0xf));
      lf::base::AssertionFailed(&local_248,&local_270,0x23,&local_298);
      std::__cxx11::string::~string((string *)&local_298);
      std::allocator<char>::~allocator((allocator<char> *)(local_2a8 + 0xf));
      std::__cxx11::string::~string((string *)&local_270);
      std::allocator<char>::~allocator(&local_271);
      std::__cxx11::string::~string((string *)&local_248);
      std::allocator<char>::~allocator(&local_249);
      abort();
    }
    std::make_unique<lf::geometry::SegmentO1,Eigen::Matrix<double,_1,2,0,_1,2>const&>
              ((Matrix<double,__1,_2,_0,__1,_2> *)local_2a8);
    std::unique_ptr<lf::geometry::Geometry,std::default_delete<lf::geometry::Geometry>>::
    unique_ptr<lf::geometry::SegmentO1,std::default_delete<lf::geometry::SegmentO1>,void>
              ((unique_ptr<lf::geometry::Geometry,std::default_delete<lf::geometry::Geometry>> *)
               this,(unique_ptr<lf::geometry::SegmentO1,_std::default_delete<lf::geometry::SegmentO1>_>
                     *)local_2a8);
    std::unique_ptr<lf::geometry::SegmentO1,_std::default_delete<lf::geometry::SegmentO1>_>::
    ~unique_ptr((unique_ptr<lf::geometry::SegmentO1,_std::default_delete<lf::geometry::SegmentO1>_>
                 *)local_2a8);
  }
  else {
    if (i != 1) {
      std::__cxx11::stringstream::stringstream(local_6e0);
      std::operator<<(local_6d0,"codim is out of bounds.");
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_700,"false",&local_701);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_728,
                 "/workspace/llm4binary/github/license_c_cmakelists/craffael[P]lehrfempp/lib/lf/geometry/segment_o1.cc"
                 ,&local_729);
      std::__cxx11::stringstream::str();
      lf::base::AssertionFailed(&local_700,&local_728,0x2a,&local_750);
      std::__cxx11::string::~string((string *)&local_750);
      std::__cxx11::string::~string((string *)&local_728);
      std::allocator<char>::~allocator(&local_729);
      std::__cxx11::string::~string((string *)&local_700);
      std::allocator<char>::~allocator(&local_701);
      this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::runtime_error::runtime_error(this_00,"this code should not be reached");
      __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
    if (1 < in_ECX) {
      std::__cxx11::stringstream::stringstream(local_430);
      std::operator<<(local_420,"i is out of bounds.");
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_450,"i >= 0 && i < 2",&local_451);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_478,
                 "/workspace/llm4binary/github/license_c_cmakelists/craffael[P]lehrfempp/lib/lf/geometry/segment_o1.cc"
                 ,&local_479);
      std::__cxx11::stringstream::str();
      lf::base::AssertionFailed(&local_450,&local_478,0x27,&local_4a0);
      std::__cxx11::string::~string((string *)&local_4a0);
      std::__cxx11::string::~string((string *)&local_478);
      std::allocator<char>::~allocator(&local_479);
      std::__cxx11::string::~string((string *)&local_450);
      std::allocator<char>::~allocator(&local_451);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_4c0,"false",&local_4c1);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_4e8,
                 "/workspace/llm4binary/github/license_c_cmakelists/craffael[P]lehrfempp/lib/lf/geometry/segment_o1.cc"
                 ,&local_4e9);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_510,"",(allocator<char> *)(local_520 + 0xf));
      lf::base::AssertionFailed(&local_4c0,&local_4e8,0x27,&local_510);
      std::__cxx11::string::~string((string *)&local_510);
      std::allocator<char>::~allocator((allocator<char> *)(local_520 + 0xf));
      std::__cxx11::string::~string((string *)&local_4e8);
      std::allocator<char>::~allocator(&local_4e9);
      std::__cxx11::string::~string((string *)&local_4c0);
      std::allocator<char>::~allocator(&local_4c1);
      abort();
    }
    Eigen::DenseBase<Eigen::Matrix<double,_-1,_2,_0,_-1,_2>_>::col
              (&local_558,(DenseBase<Eigen::Matrix<double,__1,_2,_0,__1,_2>_> *)(_i_local + 8),
               (ulong)in_ECX);
    std::
    make_unique<lf::geometry::Point,Eigen::Block<Eigen::Matrix<double,_1,2,0,_1,2>const,_1,1,true>const>
              ((Block<const_Eigen::Matrix<double,__1,_2,_0,__1,_2>,__1,_1,_true> *)local_520);
    std::unique_ptr<lf::geometry::Geometry,std::default_delete<lf::geometry::Geometry>>::
    unique_ptr<lf::geometry::Point,std::default_delete<lf::geometry::Point>,void>
              ((unique_ptr<lf::geometry::Geometry,std::default_delete<lf::geometry::Geometry>> *)
               this,(unique_ptr<lf::geometry::Point,_std::default_delete<lf::geometry::Point>_> *)
                    local_520);
    std::unique_ptr<lf::geometry::Point,_std::default_delete<lf::geometry::Point>_>::~unique_ptr
              ((unique_ptr<lf::geometry::Point,_std::default_delete<lf::geometry::Point>_> *)
               local_520);
  }
  return (__uniq_ptr_data<lf::geometry::Geometry,_std::default_delete<lf::geometry::Geometry>,_true,_true>
          )(__uniq_ptr_data<lf::geometry::Geometry,_std::default_delete<lf::geometry::Geometry>,_true,_true>
            )this;
}

Assistant:

std::unique_ptr<Geometry> SegmentO1::SubGeometry(dim_t codim, dim_t i) const {
  if (codim == 0) {
    LF_ASSERT_MSG(i == 0, "i is out of bounds.");
    return std::make_unique<SegmentO1>(coords_);
  }
  if (codim == 1) {
    LF_ASSERT_MSG(i >= 0 && i < 2, "i is out of bounds.");
    return std::make_unique<Point>(coords_.col(i));
  }
  LF_VERIFY_MSG(false, "codim is out of bounds.");
}